

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_compiler_mask_stage_output_by_location(spvc_compiler compiler,uint location,uint component)

{
  spvc_context_s *this;
  CompilerGLSL *this_00;
  allocator local_41;
  string local_40;
  uint local_20;
  uint local_1c;
  uint component_local;
  uint location_local;
  spvc_compiler compiler_local;
  
  local_20 = component;
  local_1c = location;
  _component_local = compiler;
  if (compiler->backend == SPVC_BACKEND_NONE) {
    this = compiler->context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,
               "Cross-compilation related option used on NONE backend which only supports reflection."
               ,&local_41);
    spvc_context_s::report_error(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    compiler_local._4_4_ = SPVC_ERROR_INVALID_ARGUMENT;
  }
  else {
    this_00 = (CompilerGLSL *)
              std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
              get(&compiler->compiler);
    spirv_cross::CompilerGLSL::mask_stage_output_by_location(this_00,local_1c,local_20);
    compiler_local._4_4_ = SPVC_SUCCESS;
  }
  return compiler_local._4_4_;
}

Assistant:

spvc_result spvc_compiler_mask_stage_output_by_location(spvc_compiler compiler,
                                                        unsigned location, unsigned component)
{
#if SPIRV_CROSS_C_API_GLSL
	if (compiler->backend == SPVC_BACKEND_NONE)
	{
		compiler->context->report_error("Cross-compilation related option used on NONE backend which only supports reflection.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	static_cast<CompilerGLSL *>(compiler->compiler.get())->mask_stage_output_by_location(location, component);
	return SPVC_SUCCESS;
#else
	(void)location;
	(void)component;
	compiler->context->report_error("Cross-compilation related option used on NONE backend which only supports reflection.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}